

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void ON_BrepTransformSwapSrfHelper(ON_Brep *brep,ON_NurbsSurface *nurbs_srf,int si)

{
  bool bVar1;
  int iVar2;
  ON_Surface **ppOVar3;
  ON_BrepFace *pOVar4;
  ON_UserData *pOVar5;
  int local_54;
  bool bIsTransposed;
  int fi;
  ON_BrepFace *f;
  int fcount;
  undefined1 local_38 [8];
  ON_UserDataHolder udholder;
  ON_Surface *old_srf;
  int si_local;
  ON_NurbsSurface *nurbs_srf_local;
  ON_Brep *brep_local;
  
  ppOVar3 = ON_SimpleArray<ON_Surface_*>::operator[]
                      (&(brep->m_S).super_ON_SimpleArray<ON_Surface_*>,si);
  udholder.super_ON_Object.m_userdata_list = (ON_UserData *)*ppOVar3;
  ON_UserDataHolder::ON_UserDataHolder((ON_UserDataHolder *)local_38);
  ON_UserDataHolder::MoveUserDataFrom
            ((ON_UserDataHolder *)local_38,
             &(udholder.super_ON_Object.m_userdata_list)->super_ON_Object);
  ON_UserDataHolder::MoveUserDataTo((ON_UserDataHolder *)local_38,(ON_Object *)nurbs_srf,false);
  ppOVar3 = ON_SimpleArray<ON_Surface_*>::operator[]
                      (&(brep->m_S).super_ON_SimpleArray<ON_Surface_*>,si);
  *ppOVar3 = &nurbs_srf->super_ON_Surface;
  iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
  pOVar4 = ON_ClassArray<ON_BrepFace>::Array((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
  for (local_54 = 0; local_54 < iVar2; local_54 = local_54 + 1) {
    if ((pOVar4[local_54].m_si == si) ||
       (pOVar5 = (ON_UserData *)
                 ON_SurfaceProxy::ProxySurface(&pOVar4[local_54].super_ON_SurfaceProxy),
       pOVar5 == udholder.super_ON_Object.m_userdata_list)) {
      bVar1 = ON_SurfaceProxy::ProxySurfaceIsTransposed(&pOVar4[local_54].super_ON_SurfaceProxy);
      ON_SurfaceProxy::SetProxySurface
                (&pOVar4[local_54].super_ON_SurfaceProxy,&nurbs_srf->super_ON_Surface);
      if (bVar1) {
        ON_SurfaceProxy::Transpose(&pOVar4[local_54].super_ON_SurfaceProxy);
      }
    }
  }
  if (udholder.super_ON_Object.m_userdata_list != (ON_UserData *)0x0) {
    (*((udholder.super_ON_Object.m_userdata_list)->super_ON_Object)._vptr_ON_Object[4])();
  }
  ON_UserDataHolder::~ON_UserDataHolder((ON_UserDataHolder *)local_38);
  return;
}

Assistant:

static void ON_BrepTransformSwapSrfHelper( ON_Brep& brep, ON_NurbsSurface* nurbs_srf, int si )
{
  // Replace plane surface which could not be properly transformed
  // with nurbs_surface.
  ON_Surface* old_srf = brep.m_S[si];
  ON_UserDataHolder udholder;
  udholder.MoveUserDataFrom(*old_srf);
  udholder.MoveUserDataTo(*nurbs_srf,false);
  brep.m_S[si] = nurbs_srf;
  
  // Update faces to use new surface.
  const int fcount = brep.m_F.Count();
  ON_BrepFace* f = brep.m_F.Array();
  for ( int fi = 0; fi < fcount; fi++ )
  {
    if (f[fi].m_si == si || f[fi].ProxySurface() == old_srf )
    {
      const bool bIsTransposed = f[fi].ProxySurfaceIsTransposed();
      f[fi].SetProxySurface(nurbs_srf);
      if (bIsTransposed)
        f[fi].ON_SurfaceProxy::Transpose();
    }
  }

  delete old_srf;
}